

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

int Wla_ManShrinkAbs(Wla_Man_t *pWla,int nFrames,int RunId)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vWhites_00;
  Vec_Int_t *vBlacks_00;
  Vec_Bit_t *p;
  Vec_Bit_t *vCoreMarks;
  Vec_Int_t *vBlacks;
  Vec_Int_t *vWhites;
  int RetValue;
  int Entry;
  int i;
  int RunId_local;
  int nFrames_local;
  Wla_Man_t *pWla_local;
  
  vWhites_00 = Wla_ManCollectNodes(pWla,0);
  vBlacks_00 = Wla_ManCollectNodes(pWla,1);
  p = Wlc_NtkProofReduce(pWla->p,pWla->pPars,nFrames,vWhites_00,vBlacks_00,RunId);
  if (p == (Vec_Bit_t *)0x0) {
    Vec_IntFree(vWhites_00);
    Vec_IntFree(vBlacks_00);
    pWla_local._4_4_ = 0xffffffff;
  }
  else {
    iVar1 = Vec_IntSize(vWhites_00);
    iVar2 = Vec_BitCount(p);
    pWla_local._4_4_ = (uint)(iVar1 != iVar2);
    for (RetValue = 0; iVar1 = Vec_IntSize(vWhites_00), RetValue < iVar1; RetValue = RetValue + 1) {
      iVar1 = Vec_IntEntry(vWhites_00,RetValue);
      iVar2 = Vec_BitEntry(p,RetValue);
      if (iVar2 == 0) {
        Vec_BitWriteEntry(pWla->vUnmark,iVar1,0);
      }
    }
    Vec_IntFree(vWhites_00);
    Vec_IntFree(vBlacks_00);
    Vec_BitFree(p);
  }
  return pWla_local._4_4_;
}

Assistant:

int Wla_ManShrinkAbs( Wla_Man_t * pWla, int nFrames, int RunId )
{
    int i, Entry;
    int RetValue = 0;

    Vec_Int_t * vWhites = Wla_ManCollectNodes( pWla, 0 );
    Vec_Int_t * vBlacks = Wla_ManCollectNodes( pWla, 1 );
    Vec_Bit_t * vCoreMarks = Wlc_NtkProofReduce( pWla->p, pWla->pPars, nFrames, vWhites, vBlacks, RunId );

    if ( vCoreMarks == NULL )
    {
        Vec_IntFree( vWhites );
        Vec_IntFree( vBlacks );
        return -1;
    }

    RetValue = Vec_IntSize( vWhites ) != Vec_BitCount( vCoreMarks );

    Vec_IntForEachEntry( vWhites, Entry, i )
        if ( !Vec_BitEntry( vCoreMarks, i ) )
            Vec_BitWriteEntry( pWla->vUnmark, Entry, 0 );

    Vec_IntFree( vWhites );
    Vec_IntFree( vBlacks );
    Vec_BitFree( vCoreMarks );

    return RetValue;
}